

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O3

void __thiscall
cmNinjaTargetGenerator::WriteObjectBuildStatement(cmNinjaTargetGenerator *this,cmSourceFile *source)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  cmLocalNinjaGenerator *pcVar3;
  cmMakefile *this_00;
  cmGeneratorTarget *target;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  pointer pbVar6;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  pointer pbVar9;
  pointer pbVar10;
  size_type sVar11;
  pointer pbVar12;
  bool bVar13;
  int iVar14;
  int iVar15;
  string *psVar16;
  char *pcVar17;
  mapped_type *pmVar18;
  long *plVar19;
  mapped_type *defines;
  mapped_type *includes;
  size_t sVar20;
  MapToNinjaPathImpl MVar21;
  cmCustomCommand *pcVar22;
  cmGlobalNinjaGenerator *pcVar23;
  iterator iVar24;
  mapped_type *this_01;
  cmGlobalNinjaGenerator *pcVar25;
  size_type *psVar26;
  undefined8 uVar27;
  _Alloc_hider _Var28;
  cmNinjaTargetGenerator *pcVar29;
  uint uVar30;
  string *odi;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  pVar31;
  string sourceDirectoryFlag;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string language;
  string repVar;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_390;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_378;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_360;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_348;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_330;
  _Alloc_hider local_300;
  size_type local_2f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_3;
  string objectFileName;
  string cmakeLinkVar;
  string cmakeVarLang;
  string sourceFileName;
  string objectFileDir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sourceDirectory;
  undefined1 *local_1f8;
  undefined8 local_1f0;
  undefined1 local_1e8 [16];
  key_type local_1d8;
  key_type local_1b8;
  string local_198;
  string local_178;
  string objectDir;
  undefined1 local_138 [160];
  cmNinjaDeps local_98;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_80;
  _Alloc_hider local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  pcVar29 = (cmNinjaTargetGenerator *)&sourceDirectoryFlag;
  cmSourceFile::GetLanguage_abi_cxx11_(&language,source);
  iVar14 = std::__cxx11::string::compare((char *)&language);
  if (iVar14 == 0) {
    psVar16 = cmSourceFile::GetFullPath_abi_cxx11_(source);
    sourceFileName._M_dataplus._M_p = (pointer)&sourceFileName.field_2;
    pcVar2 = (psVar16->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&sourceFileName,pcVar2,pcVar2 + psVar16->_M_string_length);
  }
  else {
    psVar16 = cmSourceFile::GetFullPath_abi_cxx11_(source);
    ConvertToNinjaPath(&sourceFileName,this,psVar16);
  }
  cmGeneratorTarget::GetSupportDirectory_abi_cxx11_
            ((string *)local_138,(this->super_cmCommonTargetGenerator).GeneratorTarget);
  ConvertToNinjaPath(&objectDir,this,(string *)local_138);
  pcVar2 = local_138 + 0x10;
  if ((pointer)local_138._0_8_ != pcVar2) {
    operator_delete((void *)local_138._0_8_,CONCAT71(local_138._17_7_,local_138[0x10]) + 1);
  }
  GetObjectFilePath_abi_cxx11_((string *)local_138,this,source);
  ConvertToNinjaPath(&objectFileName,this,(string *)local_138);
  if ((pointer)local_138._0_8_ != pcVar2) {
    operator_delete((void *)local_138._0_8_,CONCAT71(local_138._17_7_,local_138[0x10]) + 1);
  }
  cmsys::SystemTools::GetFilenamePath(&objectFileDir,&objectFileName);
  cmakeVarLang._M_dataplus._M_p = (pointer)&cmakeVarLang.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&cmakeVarLang,"CMAKE_","");
  std::__cxx11::string::_M_append((char *)&cmakeVarLang,(ulong)language._M_dataplus._M_p);
  cmakeLinkVar._M_dataplus._M_p = (pointer)&cmakeLinkVar.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&cmakeLinkVar,cmakeVarLang._M_dataplus._M_p,
             cmakeVarLang._M_dataplus._M_p + cmakeVarLang._M_string_length);
  std::__cxx11::string::append((char *)&cmakeLinkVar);
  pcVar17 = cmMakefile::GetDefinition((this->super_cmCommonTargetGenerator).Makefile,&cmakeLinkVar);
  iVar14 = std::__cxx11::string::compare((char *)&language);
  if ((iVar14 == 0) ||
     ((iVar14 = std::__cxx11::string::compare((char *)&language), pcVar17 == (char *)0x0 &&
      (iVar14 == 0)))) {
    uVar30 = 0;
  }
  else {
    bVar13 = ForceResponseFile(this);
    uVar30 = (uint)bVar13;
  }
  LanguageCompilerRule(&local_178,this,&language);
  local_138._32_8_ = local_138 + 0x30;
  local_138._8_8_ = 0;
  local_138[0x10] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p == &local_178.field_2) {
    local_138._56_8_ = local_178.field_2._8_8_;
  }
  else {
    local_138._32_8_ = local_178._M_dataplus._M_p;
  }
  local_80._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_80._M_impl.super__Rb_tree_header._M_header;
  local_138._40_8_ = local_178._M_string_length;
  local_178._M_string_length = 0;
  local_178.field_2._M_local_buf[0] = '\0';
  local_80._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_80._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_138._64_8_ = (pointer)0x0;
  local_138._72_8_ = (pointer)0x0;
  local_138._80_8_ = (pointer)0x0;
  local_138._88_8_ = (pointer)0x0;
  local_138._96_8_ = (pointer)0x0;
  local_138._104_8_ = (pointer)0x0;
  local_138._112_8_ = (_Base_ptr)0x0;
  local_138._120_8_ = (_Base_ptr)0x0;
  local_138._128_8_ = (pointer)0x0;
  local_138._136_8_ = (cmLocalNinjaGenerator *)0x0;
  local_138._144_8_ = (_Base_ptr)0x0;
  local_138._152_8_ = (_Base_ptr)0x0;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_80._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_50._M_p = (pointer)&local_40;
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  local_138._0_8_ = pcVar2;
  local_80._M_impl.super__Rb_tree_header._M_header._M_right =
       local_80._M_impl.super__Rb_tree_header._M_header._M_left;
  ComputeFlagsForObject(&repVar,this,source,&language);
  paVar1 = &__str_2.field_2;
  __str_2._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&__str_2,"FLAGS","");
  pmVar18 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_80,&__str_2);
  std::__cxx11::string::operator=((string *)pmVar18,(string *)&repVar);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str_2._M_dataplus._M_p != paVar1) {
    operator_delete(__str_2._M_dataplus._M_p,__str_2.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)repVar._M_dataplus._M_p != &repVar.field_2) {
    operator_delete(repVar._M_dataplus._M_p,repVar.field_2._M_allocated_capacity + 1);
  }
  ComputeDefines(&repVar,this,source,&language);
  __str_2._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&__str_2,"DEFINES","");
  pmVar18 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_80,&__str_2);
  std::__cxx11::string::operator=((string *)pmVar18,(string *)&repVar);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str_2._M_dataplus._M_p != paVar1) {
    operator_delete(__str_2._M_dataplus._M_p,__str_2.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)repVar._M_dataplus._M_p != &repVar.field_2) {
    operator_delete(repVar._M_dataplus._M_p,repVar.field_2._M_allocated_capacity + 1);
  }
  ComputeIncludes(&repVar,this,source,&language);
  __str_2._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&__str_2,"INCLUDES","");
  pmVar18 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_80,&__str_2);
  std::__cxx11::string::operator=((string *)pmVar18,(string *)&repVar);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str_2._M_dataplus._M_p != paVar1) {
    operator_delete(__str_2._M_dataplus._M_p,__str_2.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)repVar._M_dataplus._M_p != &repVar.field_2) {
    operator_delete(repVar._M_dataplus._M_p,repVar.field_2._M_allocated_capacity + 1);
  }
  bVar13 = NeedDepTypeMSVC(this,&language);
  if (bVar13) goto LAB_0021e696;
  if (language._M_string_length == 0) {
LAB_0021e3f6:
    pcVar3 = this->LocalGenerator;
    __str_2._M_dataplus._M_p = (pointer)&__str_2.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__str_2,objectFileName._M_dataplus._M_p,
               objectFileName._M_dataplus._M_p + objectFileName._M_string_length);
    std::__cxx11::string::append((char *)&__str_2);
    cmOutputConverter::ConvertToOutputFormat
              (&repVar,&(pcVar3->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                        super_cmOutputConverter,&__str_2,SHELL);
    sourceDirectoryFlag._M_dataplus._M_p = (pointer)&sourceDirectoryFlag.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sourceDirectoryFlag,"DEP_FILE","");
    pmVar18 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&local_80,&sourceDirectoryFlag);
    std::__cxx11::string::operator=((string *)pmVar18,(string *)&repVar);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sourceDirectoryFlag._M_dataplus._M_p != &sourceDirectoryFlag.field_2) {
      operator_delete(sourceDirectoryFlag._M_dataplus._M_p,
                      sourceDirectoryFlag.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)repVar._M_dataplus._M_p != &repVar.field_2) {
      operator_delete(repVar._M_dataplus._M_p,repVar.field_2._M_allocated_capacity + 1);
    }
    uVar27 = __str_2.field_2._M_allocated_capacity;
    _Var28._M_p = __str_2._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str_2._M_dataplus._M_p == &__str_2.field_2) goto LAB_0021e696;
  }
  else {
    repVar._M_dataplus._M_p = (pointer)&repVar.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&repVar,"CMAKE_","");
    std::__cxx11::string::_M_append((char *)&repVar,(ulong)language._M_dataplus._M_p);
    std::__cxx11::string::append((char *)&repVar);
    bVar13 = cmMakefile::IsOn((this->super_cmCommonTargetGenerator).Makefile,&repVar);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)repVar._M_dataplus._M_p != &repVar.field_2) {
      operator_delete(repVar._M_dataplus._M_p,repVar.field_2._M_allocated_capacity + 1);
    }
    if (!bVar13) goto LAB_0021e3f6;
    cmsys::SystemTools::GetFilenameWithoutLastExtension(&__str_2,&objectFileName);
    plVar19 = (long *)std::__cxx11::string::append((char *)&__str_2);
    repVar._M_dataplus._M_p = (pointer)&repVar.field_2;
    psVar26 = (size_type *)(plVar19 + 2);
    if ((size_type *)*plVar19 == psVar26) {
      repVar.field_2._M_allocated_capacity = *psVar26;
      repVar.field_2._8_8_ = plVar19[3];
    }
    else {
      repVar.field_2._M_allocated_capacity = *psVar26;
      repVar._M_dataplus._M_p = (pointer)*plVar19;
    }
    repVar._M_string_length = plVar19[1];
    *plVar19 = (long)psVar26;
    plVar19[1] = 0;
    *(undefined1 *)(plVar19 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str_2._M_dataplus._M_p != &__str_2.field_2) {
      operator_delete(__str_2._M_dataplus._M_p,__str_2.field_2._M_allocated_capacity + 1);
    }
    pcVar3 = this->LocalGenerator;
    __str_1._M_dataplus._M_p = (pointer)&__str_1.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__str_1,objectFileDir._M_dataplus._M_p,
               objectFileDir._M_dataplus._M_p + objectFileDir._M_string_length);
    std::__cxx11::string::append((char *)&__str_1);
    plVar19 = (long *)std::__cxx11::string::_M_append
                                ((char *)&__str_1,(ulong)repVar._M_dataplus._M_p);
    psVar26 = (size_type *)(plVar19 + 2);
    if ((size_type *)*plVar19 == psVar26) {
      sourceDirectoryFlag.field_2._M_allocated_capacity = *psVar26;
      sourceDirectoryFlag.field_2._8_8_ = plVar19[3];
      sourceDirectoryFlag._M_dataplus._M_p = (pointer)&sourceDirectoryFlag.field_2;
    }
    else {
      sourceDirectoryFlag.field_2._M_allocated_capacity = *psVar26;
      sourceDirectoryFlag._M_dataplus._M_p = (pointer)*plVar19;
    }
    sourceDirectoryFlag._M_string_length = plVar19[1];
    *plVar19 = (long)psVar26;
    plVar19[1] = 0;
    *(undefined1 *)(plVar19 + 2) = 0;
    cmOutputConverter::ConvertToOutputFormat
              (&__str_2,&(pcVar3->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                         super_cmOutputConverter,&sourceDirectoryFlag,SHELL);
    __str_3._M_dataplus._M_p = (pointer)&__str_3.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&__str_3,"DEP_FILE","");
    pmVar18 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&local_80,&__str_3);
    std::__cxx11::string::operator=((string *)pmVar18,(string *)&__str_2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str_3._M_dataplus._M_p != &__str_3.field_2) {
      operator_delete(__str_3._M_dataplus._M_p,__str_3.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str_2._M_dataplus._M_p != &__str_2.field_2) {
      operator_delete(__str_2._M_dataplus._M_p,__str_2.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sourceDirectoryFlag._M_dataplus._M_p != &sourceDirectoryFlag.field_2) {
      operator_delete(sourceDirectoryFlag._M_dataplus._M_p,
                      sourceDirectoryFlag.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str_1._M_dataplus._M_p != &__str_1.field_2) {
      operator_delete(__str_1._M_dataplus._M_p,__str_1.field_2._M_allocated_capacity + 1);
    }
    uVar27 = repVar.field_2._M_allocated_capacity;
    _Var28._M_p = repVar._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)repVar._M_dataplus._M_p == &repVar.field_2) goto LAB_0021e696;
  }
  operator_delete(_Var28._M_p,uVar27 + 1);
LAB_0021e696:
  repVar._M_dataplus._M_p = (pointer)&repVar.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&repVar,"FLAGS","");
  pmVar18 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_80,&repVar);
  __str_2._M_dataplus._M_p = (pointer)&__str_2.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&__str_2,"DEFINES","");
  defines = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_80,&__str_2);
  sourceDirectoryFlag._M_dataplus._M_p = (pointer)&sourceDirectoryFlag.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sourceDirectoryFlag,"INCLUDES","");
  includes = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&local_80,&sourceDirectoryFlag);
  ExportObjectCompileCommand
            (this,&language,&sourceFileName,&objectDir,&objectFileName,&objectFileDir,pmVar18,
             defines,includes);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sourceDirectoryFlag._M_dataplus._M_p != &sourceDirectoryFlag.field_2) {
    operator_delete(sourceDirectoryFlag._M_dataplus._M_p,
                    sourceDirectoryFlag.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str_2._M_dataplus._M_p != &__str_2.field_2) {
    operator_delete(__str_2._M_dataplus._M_p,__str_2.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)repVar._M_dataplus._M_p != &repVar.field_2) {
    operator_delete(repVar._M_dataplus._M_p,repVar.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_138 + 0x40),&objectFileName);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->Objects,&objectFileName);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_138 + 0x70),&sourceFileName);
  repVar._M_dataplus._M_p = (pointer)&repVar.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&repVar,"OBJECT_DEPENDS","");
  pcVar17 = cmSourceFile::GetProperty(source,&repVar);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)repVar._M_dataplus._M_p != &repVar.field_2) {
    operator_delete(repVar._M_dataplus._M_p,repVar.field_2._M_allocated_capacity + 1);
  }
  if (pcVar17 != (char *)0x0) {
    repVar._M_dataplus._M_p = (pointer)&repVar.field_2;
    sVar20 = strlen(pcVar17);
    std::__cxx11::string::_M_construct<char_const*>((string *)&repVar,pcVar17,pcVar17 + sVar20);
    cmSystemTools::ExpandedListArgument
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__str_2,&repVar,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)repVar._M_dataplus._M_p != &repVar.field_2) {
      operator_delete(repVar._M_dataplus._M_p,repVar.field_2._M_allocated_capacity + 1);
    }
    sVar11 = __str_2._M_string_length;
    if (__str_2._M_dataplus._M_p != (pointer)__str_2._M_string_length) {
      _Var28._M_p = __str_2._M_dataplus._M_p;
      do {
        bVar13 = cmsys::SystemTools::FileIsFullPath((string *)_Var28._M_p);
        if (bVar13) {
          cmsys::SystemTools::CollapseFullPath(&repVar,(string *)_Var28._M_p);
          std::__cxx11::string::operator=((string *)_Var28._M_p,(string *)&repVar);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)repVar._M_dataplus._M_p != &repVar.field_2) {
            operator_delete(repVar._M_dataplus._M_p,repVar.field_2._M_allocated_capacity + 1);
          }
        }
        _Var28._M_p = _Var28._M_p + 0x20;
      } while (_Var28._M_p != (pointer)sVar11);
    }
    sVar11 = __str_2._M_string_length;
    _Var28._M_p = __str_2._M_dataplus._M_p;
    MVar21.GG = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
    std::
    transform<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmGlobalNinjaGenerator::MapToNinjaPathImpl>
              ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )_Var28._M_p,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )sVar11,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)(local_138 + 0x88),MVar21);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__str_2);
  }
  OrderDependsTargetForTarget_abi_cxx11_(&repVar,this);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_98,&repVar)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)repVar._M_dataplus._M_p != &repVar.field_2) {
    operator_delete(repVar._M_dataplus._M_p,repVar.field_2._M_allocated_capacity + 1);
  }
  if (source->IsGenerated == true) {
    repVar._M_dataplus._M_p = (pointer)&repVar.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&repVar,"__CMAKE_GENERATED_BY_CMAKE","");
    bVar13 = cmSourceFile::GetPropertyAsBool(source,&repVar);
    if ((bVar13) ||
       (pcVar22 = cmSourceFile::GetCustomCommand(source), pcVar22 != (cmCustomCommand *)0x0)) {
      bVar13 = false;
    }
    else {
      pcVar23 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
      iVar24 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::find(&(pcVar23->CustomCommandOutputs)._M_t,&sourceFileName);
      bVar13 = (_Rb_tree_header *)iVar24._M_node ==
               &(pcVar23->CustomCommandOutputs)._M_t._M_impl.super__Rb_tree_header;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)repVar._M_dataplus._M_p != &repVar.field_2) {
      operator_delete(repVar._M_dataplus._M_p,repVar.field_2._M_allocated_capacity + 1);
    }
    if (bVar13) {
      pcVar23 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
      cmGlobalNinjaGenerator::AddAssumedSourceDependencies(pcVar23,&sourceFileName,&local_98);
    }
  }
  iVar14 = std::__cxx11::string::compare((char *)&language);
  iVar15 = std::__cxx11::string::compare((char *)&language);
  if (iVar15 == 0) {
    LanguagePreprocessRule(&local_198,this,&language);
    repVar._M_dataplus._M_p = (pointer)&repVar.field_2;
    repVar._M_string_length = 0;
    repVar.field_2._M_allocated_capacity = repVar.field_2._M_allocated_capacity & 0xffffffffffffff00
    ;
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    paVar1 = &sourceDirectoryFlag.field_2;
    local_330._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_330._M_t._M_impl.super__Rb_tree_header._M_header;
    local_198._M_string_length = 0;
    local_198.field_2._M_local_buf[0] = '\0';
    local_330._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_330._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_3a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_3a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_3a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vStack_390.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vStack_390.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_390.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_378.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_378.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_378.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vStack_360.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vStack_360.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_360.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_348.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_348.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_348.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_330._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_300._M_p = (pointer)&local_2f0;
    local_2f8 = 0;
    local_2f0._M_local_buf[0] = '\0';
    local_330._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_330._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    GetPreprocessedFilePath_abi_cxx11_(&sourceDirectoryFlag,this,source);
    ConvertToNinjaPath(&__str_2,this,&sourceDirectoryFlag);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sourceDirectoryFlag._M_dataplus._M_p != paVar1) {
      operator_delete(sourceDirectoryFlag._M_dataplus._M_p,
                      sourceDirectoryFlag.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_3a8,&__str_2);
    sourceDirectoryFlag._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&sourceDirectoryFlag,__str_2._M_dataplus._M_p,
               __str_2._M_dataplus._M_p + __str_2._M_string_length);
    std::__cxx11::string::append((char *)&sourceDirectoryFlag);
    std::__cxx11::string::operator=((string *)&local_300,(string *)&sourceDirectoryFlag);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sourceDirectoryFlag._M_dataplus._M_p != paVar1) {
      operator_delete(sourceDirectoryFlag._M_dataplus._M_p,
                      sourceDirectoryFlag.field_2._M_allocated_capacity + 1);
    }
    iVar15 = std::__cxx11::string::compare((char *)&language);
    pbVar12 = local_348.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (iVar15 == 0) {
      p_Var4 = (_Base_ptr)local_138._112_8_;
      p_Var5 = (_Base_ptr)local_138._120_8_;
      local_138._112_8_ =
           local_378.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_138._120_8_ =
           local_378.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      pbVar6 = (pointer)local_138._128_8_;
      pcVar3 = (cmLocalNinjaGenerator *)local_138._136_8_;
      local_138._128_8_ =
           local_378.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_138._136_8_ =
           vStack_360.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      p_Var7 = (_Base_ptr)local_138._144_8_;
      p_Var8 = (_Base_ptr)local_138._152_8_;
      local_138._144_8_ =
           vStack_360.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_138._152_8_ =
           vStack_360.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_348.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_98.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pbVar9 = local_98.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar10 = local_98.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      local_98.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_348.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_98.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_348.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_98.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pbVar12;
      sourceDirectoryFlag._M_dataplus._M_p = (pointer)paVar1;
      local_378.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)p_Var4;
      local_378.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var5;
      local_378.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pbVar6;
      vStack_360.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)pcVar3;
      vStack_360.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var7;
      vStack_360.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)p_Var8;
      local_348.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = pbVar9;
      local_348.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pbVar10;
      std::__cxx11::string::_M_construct<char_const*>((string *)&sourceDirectoryFlag,"IN_ABS","");
      pmVar18 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&local_330,&sourceDirectoryFlag);
      __str_1._M_dataplus._M_p = (pointer)&__str_1.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&__str_1,"IN_ABS","");
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&local_80,&__str_1);
      std::__cxx11::string::swap((string *)pmVar18);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_1._M_dataplus._M_p != &__str_1.field_2) {
        operator_delete(__str_1._M_dataplus._M_p,__str_1.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sourceDirectoryFlag._M_dataplus._M_p != paVar1) {
        operator_delete(sourceDirectoryFlag._M_dataplus._M_p,
                        sourceDirectoryFlag.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_138 + 0x70),&__str_2);
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&local_378,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_138 + 0x70));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&vStack_360,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_138 + 0x88));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&local_348,&local_98);
      sourceDirectoryFlag._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&sourceDirectoryFlag,"IN_ABS","");
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&local_80,&sourceDirectoryFlag);
      __str_1._M_dataplus._M_p = (pointer)&__str_1.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&__str_1,"IN_ABS","");
      pmVar18 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&local_330,&__str_1);
      std::__cxx11::string::_M_assign((string *)pmVar18);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_1._M_dataplus._M_p != &__str_1.field_2) {
        operator_delete(__str_1._M_dataplus._M_p,__str_1.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sourceDirectoryFlag._M_dataplus._M_p != paVar1) {
        operator_delete(sourceDirectoryFlag._M_dataplus._M_p,
                        sourceDirectoryFlag.field_2._M_allocated_capacity + 1);
      }
    }
    sourceDirectoryFlag._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sourceDirectoryFlag,"FLAGS","");
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_80,&sourceDirectoryFlag);
    paVar1 = &__str_1.field_2;
    __str_1._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&__str_1,"FLAGS","");
    pmVar18 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&local_330,&__str_1);
    std::__cxx11::string::_M_assign((string *)pmVar18);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str_1._M_dataplus._M_p != paVar1) {
      operator_delete(__str_1._M_dataplus._M_p,__str_1.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sourceDirectoryFlag._M_dataplus._M_p != &sourceDirectoryFlag.field_2) {
      operator_delete(sourceDirectoryFlag._M_dataplus._M_p,
                      sourceDirectoryFlag.field_2._M_allocated_capacity + 1);
    }
    if (iVar15 == 0) {
      this_00 = (this->super_cmCommonTargetGenerator).Makefile;
      std::operator+(&__str_1,"CMAKE_",&language);
      plVar19 = (long *)std::__cxx11::string::append((char *)&__str_1);
      sourceDirectoryFlag._M_dataplus._M_p = (pointer)&sourceDirectoryFlag.field_2;
      psVar26 = (size_type *)(plVar19 + 2);
      if ((size_type *)*plVar19 == psVar26) {
        sourceDirectoryFlag.field_2._M_allocated_capacity = *psVar26;
        sourceDirectoryFlag.field_2._8_8_ = plVar19[3];
      }
      else {
        sourceDirectoryFlag.field_2._M_allocated_capacity = *psVar26;
        sourceDirectoryFlag._M_dataplus._M_p = (pointer)*plVar19;
      }
      sourceDirectoryFlag._M_string_length = plVar19[1];
      *plVar19 = (long)psVar26;
      plVar19[1] = 0;
      *(undefined1 *)(plVar19 + 2) = 0;
      psVar16 = cmMakefile::GetSafeDefinition(this_00,&sourceDirectoryFlag);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sourceDirectoryFlag._M_dataplus._M_p != &sourceDirectoryFlag.field_2) {
        operator_delete(sourceDirectoryFlag._M_dataplus._M_p,
                        sourceDirectoryFlag.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_1._M_dataplus._M_p != paVar1) {
        operator_delete(__str_1._M_dataplus._M_p,__str_1.field_2._M_allocated_capacity + 1);
      }
      pcVar3 = this->LocalGenerator;
      sourceDirectoryFlag._M_dataplus._M_p = (pointer)&sourceDirectoryFlag.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&sourceDirectoryFlag,"FLAGS","");
      pmVar18 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_80,&sourceDirectoryFlag);
      (*(pcVar3->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[6])
                (pcVar3,pmVar18,psVar16);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sourceDirectoryFlag._M_dataplus._M_p != &sourceDirectoryFlag.field_2) {
        operator_delete(sourceDirectoryFlag._M_dataplus._M_p,
                        sourceDirectoryFlag.field_2._M_allocated_capacity + 1);
      }
      sourceDirectoryFlag._M_dataplus._M_p = (pointer)&sourceDirectoryFlag.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&sourceDirectoryFlag,"DEFINES","");
      pmVar18 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&local_330,&sourceDirectoryFlag);
      __str_1._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&__str_1,"DEFINES","");
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&local_80,&__str_1);
      std::__cxx11::string::swap((string *)pmVar18);
    }
    else {
      sourceDirectoryFlag._M_dataplus._M_p = (pointer)&sourceDirectoryFlag.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&sourceDirectoryFlag,"DEFINES","");
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&local_80,&sourceDirectoryFlag);
      __str_1._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&__str_1,"DEFINES","");
      pmVar18 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&local_330,&__str_1);
      std::__cxx11::string::_M_assign((string *)pmVar18);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str_1._M_dataplus._M_p != paVar1) {
      operator_delete(__str_1._M_dataplus._M_p,__str_1.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sourceDirectoryFlag._M_dataplus._M_p != &sourceDirectoryFlag.field_2) {
      operator_delete(sourceDirectoryFlag._M_dataplus._M_p,
                      sourceDirectoryFlag.field_2._M_allocated_capacity + 1);
    }
    sourceDirectoryFlag._M_dataplus._M_p = (pointer)&sourceDirectoryFlag.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sourceDirectoryFlag,"INCLUDES","");
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_80,&sourceDirectoryFlag);
    __str_1._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&__str_1,"INCLUDES","");
    pmVar18 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&local_330,&__str_1);
    std::__cxx11::string::_M_assign((string *)pmVar18);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str_1._M_dataplus._M_p != paVar1) {
      operator_delete(__str_1._M_dataplus._M_p,__str_1.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sourceDirectoryFlag._M_dataplus._M_p != &sourceDirectoryFlag.field_2) {
      operator_delete(sourceDirectoryFlag._M_dataplus._M_p,
                      sourceDirectoryFlag.field_2._M_allocated_capacity + 1);
    }
    if (iVar15 == 0) {
      sourceDirectory.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      sourceDirectory.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      sourceDirectory.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      psVar16 = cmSourceFile::GetFullPath_abi_cxx11_(source);
      cmsys::SystemTools::GetParentDirectory(&sourceDirectoryFlag,psVar16);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &sourceDirectory,&sourceDirectoryFlag);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sourceDirectoryFlag._M_dataplus._M_p != &sourceDirectoryFlag.field_2) {
        operator_delete(sourceDirectoryFlag._M_dataplus._M_p,
                        sourceDirectoryFlag.field_2._M_allocated_capacity + 1);
      }
      target = (this->super_cmCommonTargetGenerator).GeneratorTarget;
      pcVar3 = this->LocalGenerator;
      psVar16 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_
                          (&this->super_cmCommonTargetGenerator);
      cmLocalGenerator::GetIncludeFlags
                (&sourceDirectoryFlag,(cmLocalGenerator *)pcVar3,&sourceDirectory,target,&language,
                 false,false,psVar16);
      __str_3._M_dataplus._M_p = (pointer)&__str_3.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__str_3,sourceDirectoryFlag._M_dataplus._M_p,
                 sourceDirectoryFlag._M_dataplus._M_p + sourceDirectoryFlag._M_string_length);
      std::__cxx11::string::append((char *)&__str_3);
      local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"INCLUDES","");
      pmVar18 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_80,&local_1b8);
      plVar19 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&__str_3,(ulong)(pmVar18->_M_dataplus)._M_p);
      psVar26 = (size_type *)(plVar19 + 2);
      if ((size_type *)*plVar19 == psVar26) {
        __str_1.field_2._M_allocated_capacity = *psVar26;
        __str_1.field_2._8_4_ = (undefined4)plVar19[3];
        __str_1.field_2._12_4_ = *(undefined4 *)((long)plVar19 + 0x1c);
        __str_1._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        __str_1.field_2._M_allocated_capacity = *psVar26;
        __str_1._M_dataplus._M_p = (pointer)*plVar19;
      }
      __str_1._M_string_length = plVar19[1];
      *plVar19 = (long)psVar26;
      plVar19[1] = 0;
      *(undefined1 *)(plVar19 + 2) = 0;
      local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"INCLUDES","");
      pmVar18 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_80,&local_1d8);
      std::__cxx11::string::operator=((string *)pmVar18,(string *)&__str_1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_1._M_dataplus._M_p != paVar1) {
        operator_delete(__str_1._M_dataplus._M_p,__str_1.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
        operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_3._M_dataplus._M_p != &__str_3.field_2) {
        operator_delete(__str_3._M_dataplus._M_p,__str_3.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sourceDirectoryFlag._M_dataplus._M_p != &sourceDirectoryFlag.field_2) {
        operator_delete(sourceDirectoryFlag._M_dataplus._M_p,
                        sourceDirectoryFlag.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&sourceDirectory);
    }
    pcVar3 = this->LocalGenerator;
    __str_1._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__str_1,objectFileName._M_dataplus._M_p,
               objectFileName._M_dataplus._M_p + objectFileName._M_string_length);
    std::__cxx11::string::append((char *)&__str_1);
    cmOutputConverter::ConvertToOutputFormat
              (&sourceDirectoryFlag,
               &(pcVar3->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,&__str_1,SHELL);
    __str_3._M_dataplus._M_p = (pointer)&__str_3.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&__str_3,"DEP_FILE","");
    pmVar18 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&local_330,&__str_3);
    std::__cxx11::string::operator=((string *)pmVar18,(string *)&sourceDirectoryFlag);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str_3._M_dataplus._M_p != &__str_3.field_2) {
      operator_delete(__str_3._M_dataplus._M_p,__str_3.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sourceDirectoryFlag._M_dataplus._M_p != &sourceDirectoryFlag.field_2) {
      operator_delete(sourceDirectoryFlag._M_dataplus._M_p,
                      sourceDirectoryFlag.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str_1._M_dataplus._M_p != paVar1) {
      operator_delete(__str_1._M_dataplus._M_p,__str_1.field_2._M_allocated_capacity + 1);
    }
    if (iVar15 == 0) {
      sourceDirectoryFlag._M_dataplus._M_p = (pointer)&sourceDirectoryFlag.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&sourceDirectoryFlag,"DEP_FILE","");
      pVar31 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::equal_range(&local_80,&sourceDirectoryFlag);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::_M_erase_aux(&local_80,(_Base_ptr)pVar31.first._M_node,(_Base_ptr)pVar31.second._M_node);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sourceDirectoryFlag._M_dataplus._M_p != &sourceDirectoryFlag.field_2) {
        operator_delete(sourceDirectoryFlag._M_dataplus._M_p,
                        sourceDirectoryFlag.field_2._M_allocated_capacity + 1);
      }
    }
    if (iVar14 == 0) {
      sourceDirectoryFlag._M_dataplus._M_p = (pointer)&sourceDirectoryFlag.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&sourceDirectoryFlag,"OBJ_FILE","");
      pmVar18 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&local_330,&sourceDirectoryFlag);
      std::__cxx11::string::_M_assign((string *)pmVar18);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sourceDirectoryFlag._M_dataplus._M_p != &sourceDirectoryFlag.field_2) {
        operator_delete(sourceDirectoryFlag._M_dataplus._M_p,
                        sourceDirectoryFlag.field_2._M_allocated_capacity + 1);
      }
      sourceDirectoryFlag._M_dataplus._M_p = (pointer)&sourceDirectoryFlag.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&sourceDirectoryFlag,objectFileName._M_dataplus._M_p,
                 objectFileName._M_dataplus._M_p + objectFileName._M_string_length);
      std::__cxx11::string::append((char *)&sourceDirectoryFlag);
      __str_1._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&__str_1,"DYNDEP_INTERMEDIATE_FILE","");
      pmVar18 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&local_330,&__str_1);
      std::__cxx11::string::_M_assign((string *)pmVar18);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_1._M_dataplus._M_p != paVar1) {
        operator_delete(__str_1._M_dataplus._M_p,__str_1.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&vStack_390,&sourceDirectoryFlag);
      this_01 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                ::operator[](&this->DDIFiles,&language);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(this_01,&sourceDirectoryFlag);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sourceDirectoryFlag._M_dataplus._M_p != &sourceDirectoryFlag.field_2) {
        operator_delete(sourceDirectoryFlag._M_dataplus._M_p,
                        sourceDirectoryFlag.field_2._M_allocated_capacity + 1);
      }
    }
    sourceDirectoryFlag._M_dataplus._M_p = (pointer)&sourceDirectoryFlag.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&sourceDirectoryFlag,"JOB_POOL_COMPILE","");
    addPoolNinjaVariable
              (pcVar29,&sourceDirectoryFlag,(this->super_cmCommonTargetGenerator).GeneratorTarget,
               &local_330);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sourceDirectoryFlag._M_dataplus._M_p != &sourceDirectoryFlag.field_2) {
      operator_delete(sourceDirectoryFlag._M_dataplus._M_p,
                      sourceDirectoryFlag.field_2._M_allocated_capacity + 1);
    }
    pcVar23 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
    pcVar25 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
    cmGlobalNinjaGenerator::WriteBuild
              (pcVar23,(ostream *)
                       (pcVar25->BuildFileStream)._M_t.
                       super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                       .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,
               (cmNinjaBuild *)&repVar,-uVar30,(bool *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str_2._M_dataplus._M_p != &__str_2.field_2) {
      operator_delete(__str_2._M_dataplus._M_p,__str_2.field_2._M_allocated_capacity + 1);
    }
    cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)&repVar);
  }
  paVar1 = &__str_2.field_2;
  if (iVar14 == 0) {
    GetDyndepFilePath(&repVar,this,&language);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_98,&repVar);
    __str_2._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&__str_2,"dyndep","");
    pmVar18 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&local_80,&__str_2);
    std::__cxx11::string::_M_assign((string *)pmVar18);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str_2._M_dataplus._M_p != paVar1) {
      operator_delete(__str_2._M_dataplus._M_p,__str_2.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)repVar._M_dataplus._M_p != &repVar.field_2) {
      operator_delete(repVar._M_dataplus._M_p,repVar.field_2._M_allocated_capacity + 1);
    }
  }
  EnsureParentDirectoryExists(this,&objectFileName);
  cmOutputConverter::ConvertToOutputFormat
            (&repVar,&(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                      super_cmOutputConverter,&objectDir,SHELL);
  __str_2._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&__str_2,"OBJECT_DIR","");
  pmVar18 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_80,&__str_2);
  std::__cxx11::string::operator=((string *)pmVar18,(string *)&repVar);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str_2._M_dataplus._M_p != paVar1) {
    operator_delete(__str_2._M_dataplus._M_p,__str_2.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)repVar._M_dataplus._M_p != &repVar.field_2) {
    operator_delete(repVar._M_dataplus._M_p,repVar.field_2._M_allocated_capacity + 1);
  }
  cmOutputConverter::ConvertToOutputFormat
            (&repVar,&(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                      super_cmOutputConverter,&objectFileDir,SHELL);
  __str_2._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&__str_2,"OBJECT_FILE_DIR","");
  pmVar18 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_80,&__str_2);
  std::__cxx11::string::operator=((string *)pmVar18,(string *)&repVar);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str_2._M_dataplus._M_p != paVar1) {
    operator_delete(__str_2._M_dataplus._M_p,__str_2.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)repVar._M_dataplus._M_p != &repVar.field_2) {
    operator_delete(repVar._M_dataplus._M_p,repVar.field_2._M_allocated_capacity + 1);
  }
  pcVar29 = (cmNinjaTargetGenerator *)&repVar;
  repVar._M_dataplus._M_p = (pointer)&repVar.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)pcVar29,"JOB_POOL_COMPILE","");
  addPoolNinjaVariable
            (pcVar29,&repVar,(this->super_cmCommonTargetGenerator).GeneratorTarget,
             (cmNinjaVars *)&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)repVar._M_dataplus._M_p != &repVar.field_2) {
    operator_delete(repVar._M_dataplus._M_p,repVar.field_2._M_allocated_capacity + 1);
  }
  SetMsvcTargetPdbVariable(this,(cmNinjaVars *)&local_80);
  repVar._M_dataplus._M_p = (pointer)&repVar.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&repVar,objectFileName._M_dataplus._M_p,
             objectFileName._M_dataplus._M_p + objectFileName._M_string_length);
  std::__cxx11::string::append((char *)&repVar);
  std::__cxx11::string::operator=((string *)&local_50,(string *)&repVar);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)repVar._M_dataplus._M_p != &repVar.field_2) {
    operator_delete(repVar._M_dataplus._M_p,repVar.field_2._M_allocated_capacity + 1);
  }
  iVar14 = std::__cxx11::string::compare((char *)&language);
  if (iVar14 == 0) {
    EmitSwiftDependencyInfo(this,source);
  }
  else {
    pcVar23 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
    pcVar25 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
    cmGlobalNinjaGenerator::WriteBuild
              (pcVar23,(ostream *)
                       (pcVar25->BuildFileStream)._M_t.
                       super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                       .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,
               (cmNinjaBuild *)local_138,-uVar30,(bool *)0x0);
  }
  repVar._M_dataplus._M_p = (pointer)&repVar.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&repVar,"OBJECT_OUTPUTS","");
  pcVar17 = cmSourceFile::GetProperty(source,&repVar);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)repVar._M_dataplus._M_p != &repVar.field_2) {
    operator_delete(repVar._M_dataplus._M_p,repVar.field_2._M_allocated_capacity + 1);
  }
  if (pcVar17 != (char *)0x0) {
    local_1f8 = local_1e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"phony","");
    repVar._M_dataplus._M_p = (pointer)&repVar.field_2;
    repVar._M_string_length = 0;
    repVar.field_2._M_allocated_capacity = repVar.field_2._M_allocated_capacity & 0xffffffffffffff00
    ;
    local_330._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_330._M_t._M_impl.super__Rb_tree_header._M_header;
    local_1f0 = 0;
    local_1e8[0] = 0;
    local_330._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_330._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_3a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_3a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_3a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vStack_390.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vStack_390.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_390.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_378.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_378.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_378.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vStack_360.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vStack_360.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_360.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_348.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_348.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_348.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_330._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_300._M_p = (pointer)&local_2f0;
    local_2f8 = 0;
    local_2f0._M_local_buf[0] = '\0';
    local_330._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_330._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_1f8 = local_1e8;
    std::__cxx11::string::_M_replace((ulong)&repVar,0,(char *)0x0,0x4f7077);
    __str_2._M_dataplus._M_p = (pointer)paVar1;
    sVar20 = strlen(pcVar17);
    std::__cxx11::string::_M_construct<char_const*>((string *)&__str_2,pcVar17,pcVar17 + sVar20);
    cmSystemTools::ExpandedListArgument
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__str_1,&__str_2,false);
    sourceDirectoryFlag.field_2._M_allocated_capacity =
         (size_type)
         local_3a8.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    sourceDirectoryFlag._M_string_length =
         (size_type)
         local_3a8.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    sourceDirectoryFlag._M_dataplus._M_p =
         (pointer)local_3a8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    local_3a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)__str_1.field_2._M_allocated_capacity;
    local_3a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)__str_1._M_dataplus._M_p;
    local_3a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)__str_1._M_string_length;
    __str_1._M_dataplus._M_p = (pointer)0x0;
    __str_1._M_string_length = 0;
    __str_1.field_2._M_allocated_capacity = 0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&sourceDirectoryFlag);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__str_1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str_2._M_dataplus._M_p != paVar1) {
      operator_delete(__str_2._M_dataplus._M_p,__str_2.field_2._M_allocated_capacity + 1);
    }
    pbVar6 = local_3a8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar12 = local_3a8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    MVar21.GG = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
    std::
    transform<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmGlobalNinjaGenerator::MapToNinjaPathImpl>
              ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )pbVar12,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )pbVar6,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         )pbVar12,MVar21);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&local_378,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_138 + 0x40));
    pcVar23 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
    pcVar25 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
    cmGlobalNinjaGenerator::WriteBuild
              (pcVar23,(ostream *)
                       (pcVar25->BuildFileStream)._M_t.
                       super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                       .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,
               (cmNinjaBuild *)&repVar,0,(bool *)0x0);
    cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)&repVar);
  }
  cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cmakeLinkVar._M_dataplus._M_p != &cmakeLinkVar.field_2) {
    operator_delete(cmakeLinkVar._M_dataplus._M_p,cmakeLinkVar.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cmakeVarLang._M_dataplus._M_p != &cmakeVarLang.field_2) {
    operator_delete(cmakeVarLang._M_dataplus._M_p,cmakeVarLang.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)objectFileDir._M_dataplus._M_p != &objectFileDir.field_2) {
    operator_delete(objectFileDir._M_dataplus._M_p,objectFileDir.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)objectFileName._M_dataplus._M_p != &objectFileName.field_2) {
    operator_delete(objectFileName._M_dataplus._M_p,objectFileName.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)objectDir._M_dataplus._M_p != &objectDir.field_2) {
    operator_delete(objectDir._M_dataplus._M_p,objectDir.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sourceFileName._M_dataplus._M_p != &sourceFileName.field_2) {
    operator_delete(sourceFileName._M_dataplus._M_p,sourceFileName.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)language._M_dataplus._M_p != &language.field_2) {
    operator_delete(language._M_dataplus._M_p,language.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmNinjaTargetGenerator::WriteObjectBuildStatement(
  cmSourceFile const* source)
{
  std::string const language = source->GetLanguage();
  std::string const sourceFileName =
    language == "RC" ? source->GetFullPath() : this->GetSourceFilePath(source);
  std::string const objectDir =
    this->ConvertToNinjaPath(this->GeneratorTarget->GetSupportDirectory());
  std::string const objectFileName =
    this->ConvertToNinjaPath(this->GetObjectFilePath(source));
  std::string const objectFileDir =
    cmSystemTools::GetFilenamePath(objectFileName);

  std::string cmakeVarLang = "CMAKE_";
  cmakeVarLang += language;

  // build response file name
  std::string cmakeLinkVar = cmakeVarLang + "_RESPONSE_FILE_FLAG";

  const char* flag = GetMakefile()->GetDefinition(cmakeLinkVar);

  bool const lang_supports_response =
    !(language == "RC" || (language == "CUDA" && !flag));
  int const commandLineLengthLimit =
    ((lang_supports_response && this->ForceResponseFile())) ? -1 : 0;

  cmNinjaBuild objBuild(this->LanguageCompilerRule(language));
  cmNinjaVars& vars = objBuild.Variables;
  vars["FLAGS"] = this->ComputeFlagsForObject(source, language);
  vars["DEFINES"] = this->ComputeDefines(source, language);
  vars["INCLUDES"] = this->ComputeIncludes(source, language);

  if (!this->NeedDepTypeMSVC(language)) {
    bool replaceExt(false);
    if (!language.empty()) {
      std::string repVar = "CMAKE_";
      repVar += language;
      repVar += "_DEPFILE_EXTENSION_REPLACE";
      replaceExt = this->Makefile->IsOn(repVar);
    }
    if (!replaceExt) {
      // use original code
      vars["DEP_FILE"] = this->GetLocalGenerator()->ConvertToOutputFormat(
        objectFileName + ".d", cmOutputConverter::SHELL);
    } else {
      // Replace the original source file extension with the
      // depend file extension.
      std::string dependFileName =
        cmSystemTools::GetFilenameWithoutLastExtension(objectFileName) + ".d";
      vars["DEP_FILE"] = this->GetLocalGenerator()->ConvertToOutputFormat(
        objectFileDir + "/" + dependFileName, cmOutputConverter::SHELL);
    }
  }

  this->ExportObjectCompileCommand(
    language, sourceFileName, objectDir, objectFileName, objectFileDir,
    vars["FLAGS"], vars["DEFINES"], vars["INCLUDES"]);

  objBuild.Outputs.push_back(objectFileName);
  // Add this object to the list of object files.
  this->Objects.push_back(objectFileName);

  objBuild.ExplicitDeps.push_back(sourceFileName);

  if (const char* objectDeps = source->GetProperty("OBJECT_DEPENDS")) {
    std::vector<std::string> depList =
      cmSystemTools::ExpandedListArgument(objectDeps);
    for (std::string& odi : depList) {
      if (cmSystemTools::FileIsFullPath(odi)) {
        odi = cmSystemTools::CollapseFullPath(odi);
      }
    }
    std::transform(depList.begin(), depList.end(),
                   std::back_inserter(objBuild.ImplicitDeps),
                   MapToNinjaPath());
  }

  objBuild.OrderOnlyDeps.push_back(this->OrderDependsTargetForTarget());

  // If the source file is GENERATED and does not have a custom command
  // (either attached to this source file or another one), assume that one of
  // the target dependencies, OBJECT_DEPENDS or header file custom commands
  // will rebuild the file.
  if (source->GetIsGenerated() &&
      !source->GetPropertyAsBool("__CMAKE_GENERATED_BY_CMAKE") &&
      !source->GetCustomCommand() &&
      !this->GetGlobalGenerator()->HasCustomCommandOutput(sourceFileName)) {
    this->GetGlobalGenerator()->AddAssumedSourceDependencies(
      sourceFileName, objBuild.OrderOnlyDeps);
  }

  // For some cases we need to generate a ninja dyndep file.
  bool const needDyndep = this->NeedDyndep(language);

  // For some cases we do an explicit preprocessor invocation.
  bool const explicitPP = this->NeedExplicitPreprocessing(language);
  if (explicitPP) {
    cmNinjaBuild ppBuild(this->LanguagePreprocessRule(language));

    std::string const ppFileName =
      this->ConvertToNinjaPath(this->GetPreprocessedFilePath(source));
    ppBuild.Outputs.push_back(ppFileName);

    ppBuild.RspFile = ppFileName + ".rsp";

    bool const compilePP = this->UsePreprocessedSource(language);
    if (compilePP) {
      // Move compilation dependencies to the preprocessing build statement.
      std::swap(ppBuild.ExplicitDeps, objBuild.ExplicitDeps);
      std::swap(ppBuild.ImplicitDeps, objBuild.ImplicitDeps);
      std::swap(ppBuild.OrderOnlyDeps, objBuild.OrderOnlyDeps);
      std::swap(ppBuild.Variables["IN_ABS"], vars["IN_ABS"]);

      // The actual compilation will now use the preprocessed source.
      objBuild.ExplicitDeps.push_back(ppFileName);
    } else {
      // Copy compilation dependencies to the preprocessing build statement.
      ppBuild.ExplicitDeps = objBuild.ExplicitDeps;
      ppBuild.ImplicitDeps = objBuild.ImplicitDeps;
      ppBuild.OrderOnlyDeps = objBuild.OrderOnlyDeps;
      ppBuild.Variables["IN_ABS"] = vars["IN_ABS"];
    }

    // Preprocessing and compilation generally use the same flags.
    ppBuild.Variables["FLAGS"] = vars["FLAGS"];

    if (compilePP) {
      // In case compilation requires flags that are incompatible with
      // preprocessing, include them here.
      std::string const& postFlag = this->Makefile->GetSafeDefinition(
        "CMAKE_" + language + "_POSTPROCESS_FLAG");
      this->LocalGenerator->AppendFlags(vars["FLAGS"], postFlag);
    }

    if (compilePP) {
      // Move preprocessor definitions to the preprocessor build statement.
      std::swap(ppBuild.Variables["DEFINES"], vars["DEFINES"]);
    } else {
      // Copy preprocessor definitions to the preprocessor build statement.
      ppBuild.Variables["DEFINES"] = vars["DEFINES"];
    }

    // Copy include directories to the preprocessor build statement.  The
    // Fortran compilation build statement still needs them for the INCLUDE
    // directive.
    ppBuild.Variables["INCLUDES"] = vars["INCLUDES"];

    if (compilePP) {
      // Prepend source file's original directory as an include directory
      // so e.g. Fortran INCLUDE statements can look for files in it.
      std::vector<std::string> sourceDirectory;
      sourceDirectory.push_back(
        cmSystemTools::GetParentDirectory(source->GetFullPath()));

      std::string sourceDirectoryFlag = this->LocalGenerator->GetIncludeFlags(
        sourceDirectory, this->GeneratorTarget, language, false, false,
        this->GetConfigName());

      vars["INCLUDES"] = sourceDirectoryFlag + " " + vars["INCLUDES"];
    }

    // Explicit preprocessing always uses a depfile.
    ppBuild.Variables["DEP_FILE"] =
      this->GetLocalGenerator()->ConvertToOutputFormat(
        objectFileName + ".pp.d", cmOutputConverter::SHELL);
    if (compilePP) {
      // The actual compilation does not need a depfile because it
      // depends on the already-preprocessed source.
      vars.erase("DEP_FILE");
    }

    if (needDyndep) {
      // Tell dependency scanner the object file that will result from
      // compiling the source.
      ppBuild.Variables["OBJ_FILE"] = objectFileName;

      // Tell dependency scanner where to store dyndep intermediate results.
      std::string const ddiFile = objectFileName + ".ddi";
      ppBuild.Variables["DYNDEP_INTERMEDIATE_FILE"] = ddiFile;
      ppBuild.ImplicitOuts.push_back(ddiFile);
      this->DDIFiles[language].push_back(ddiFile);
    }

    this->addPoolNinjaVariable("JOB_POOL_COMPILE", this->GetGeneratorTarget(),
                               ppBuild.Variables);

    this->GetGlobalGenerator()->WriteBuild(this->GetBuildFileStream(), ppBuild,
                                           commandLineLengthLimit);
  }
  if (needDyndep) {
    std::string const dyndep = this->GetDyndepFilePath(language);
    objBuild.OrderOnlyDeps.push_back(dyndep);
    vars["dyndep"] = dyndep;
  }

  EnsureParentDirectoryExists(objectFileName);

  vars["OBJECT_DIR"] = this->GetLocalGenerator()->ConvertToOutputFormat(
    objectDir, cmOutputConverter::SHELL);
  vars["OBJECT_FILE_DIR"] = this->GetLocalGenerator()->ConvertToOutputFormat(
    objectFileDir, cmOutputConverter::SHELL);

  this->addPoolNinjaVariable("JOB_POOL_COMPILE", this->GetGeneratorTarget(),
                             vars);

  this->SetMsvcTargetPdbVariable(vars);

  objBuild.RspFile = objectFileName + ".rsp";

  if (language == "Swift") {
    this->EmitSwiftDependencyInfo(source);
  } else {
    this->GetGlobalGenerator()->WriteBuild(this->GetBuildFileStream(),
                                           objBuild, commandLineLengthLimit);
  }

  if (const char* objectOutputs = source->GetProperty("OBJECT_OUTPUTS")) {
    cmNinjaBuild build("phony");
    build.Comment = "Additional output files.";
    build.Outputs = cmSystemTools::ExpandedListArgument(objectOutputs);
    std::transform(build.Outputs.begin(), build.Outputs.end(),
                   build.Outputs.begin(), MapToNinjaPath());
    build.ExplicitDeps = objBuild.Outputs;
    this->GetGlobalGenerator()->WriteBuild(this->GetBuildFileStream(), build);
  }
}